

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateTimePatternGenerator::mapSkeletonMetacharacters
          (UnicodeString *__return_storage_ptr__,DateTimePatternGenerator *this,
          UnicodeString *patternForm,int32_t *flags,UErrorCode *status)

{
  short sVar1;
  ushort uVar2;
  bool bVar3;
  bool bVar4;
  char16_t cVar5;
  char16_t *pcVar6;
  ulong uVar7;
  char16_t *pcVar8;
  UnicodeString *pUVar9;
  UChar UVar10;
  ulong uVar11;
  char16_t cVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  UChar local_be;
  uint local_bc;
  UnicodeString *local_b8;
  DateTimePatternGenerator *local_b0;
  _func_int **local_a8;
  UErrorCode *local_a0;
  ulong local_98;
  byte *local_90;
  char16_t *local_88;
  ulong local_80;
  UnicodeString *local_78;
  UnicodeString local_70;
  
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  sVar1 = (patternForm->fUnion).fStackFields.fLengthAndFlags;
  local_a8 = (_func_int **)&PTR__UnicodeString_00487e70;
  if (sVar1 < 0) {
    uVar17 = (patternForm->fUnion).fFields.fLength;
  }
  else {
    uVar17 = (int)sVar1 >> 5;
  }
  uVar7 = (ulong)uVar17;
  local_b8 = __return_storage_ptr__;
  local_b0 = this;
  local_a0 = status;
  local_90 = (byte *)flags;
  if (0 < (int)uVar17) {
    pcVar8 = (char16_t *)((long)&patternForm->fUnion + 2);
    local_bc = uVar17 - 1;
    bVar3 = false;
    uVar17 = 0;
    local_98 = uVar7;
    local_88 = pcVar8;
    local_80 = uVar7;
    local_78 = patternForm;
    do {
      uVar2 = (patternForm->fUnion).fStackFields.fLengthAndFlags;
      if ((short)uVar2 < 0) {
        uVar15 = *(uint *)((long)&patternForm->fUnion + 4);
      }
      else {
        uVar15 = (int)(short)uVar2 >> 5;
      }
      cVar5 = L'\xffff';
      if (uVar17 < uVar15) {
        pcVar6 = pcVar8;
        if ((uVar2 & 2) == 0) {
          pcVar6 = (patternForm->fUnion).fFields.fArray;
        }
        cVar5 = pcVar6[(int)uVar17];
        if (cVar5 != L'\'') goto LAB_002e7cc9;
        bVar3 = !bVar3;
      }
      else {
LAB_002e7cc9:
        bVar4 = !bVar3;
        bVar3 = true;
        if (bVar4) {
          if (cVar5 == L'j') {
LAB_002e7cec:
            iVar13 = uVar17 + 1;
            iVar14 = 1;
            if (iVar13 < (int)uVar7) {
              if ((uVar2 & 2) == 0) {
                pcVar8 = (patternForm->fUnion).fFields.fArray;
              }
              uVar7 = (ulong)(local_bc - uVar17);
              uVar11 = 0;
              uVar16 = uVar17;
              do {
                cVar12 = L'\xffff';
                if (uVar16 + 1 < uVar15) {
                  cVar12 = pcVar8[(long)iVar13 + uVar11];
                }
                if (cVar12 != cVar5) {
                  uVar7 = uVar11 & 0xffffffff;
                  uVar17 = uVar16;
                  break;
                }
                uVar11 = uVar11 + 1;
                uVar16 = uVar16 + 1;
                uVar17 = local_bc;
              } while (local_98 - (long)iVar13 != uVar11);
              iVar14 = ((uint)uVar7 & 1) + 1;
              iVar13 = (int)(uVar7 >> 1) + 3;
              if ((uint)uVar7 < 2) {
                iVar13 = 1;
              }
            }
            else {
              iVar13 = 1;
            }
            if (cVar5 == L'j') {
              cVar5 = local_b0->fDefaultHourFormatChar;
              UVar10 = L'a';
            }
            else {
              cVar5 = L'h';
              switch(local_b0->fAllowedHourFormats[0]) {
              case 1:
              case 3:
              case 5:
                cVar5 = L'H';
              default:
                uVar15 = local_b0->fAllowedHourFormats[0] & 0xfffffffe;
                UVar10 = L'B';
                if (uVar15 != 4) {
                  UVar10 = (ushort)(uVar15 == 2) + L'a';
                }
                break;
              case -1:
                *local_a0 = U_INVALID_FORMAT_ERROR;
                (local_b8->super_Replaceable).super_UObject._vptr_UObject = local_a8;
                (local_b8->fUnion).fStackFields.fLengthAndFlags = 2;
                pUVar9 = local_b8;
                goto LAB_002e7e9f;
              }
            }
            if ((cVar5 != L'H') && (cVar5 != L'k')) {
              iVar13 = iVar13 + 1;
              do {
                local_be = UVar10;
                icu_63::UnicodeString::doAppend(&local_70,&local_be,0,1);
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
            patternForm = local_78;
            uVar7 = local_80;
            uVar15 = iVar14 + 1;
            do {
              local_be = cVar5;
              icu_63::UnicodeString::doAppend(&local_70,&local_be,0,1);
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
            bVar3 = false;
            pcVar8 = local_88;
          }
          else {
            if (cVar5 == L'J') {
              local_be = L'H';
              icu_63::UnicodeString::doAppend(&local_70,&local_be,0,1);
              *local_90 = *local_90 | 2;
            }
            else {
              if (cVar5 == L'C') goto LAB_002e7cec;
              local_be = cVar5;
              icu_63::UnicodeString::doAppend(&local_70,&local_be,0,1);
            }
            bVar3 = false;
          }
        }
      }
      uVar17 = uVar17 + 1;
    } while ((int)uVar17 < (int)uVar7);
  }
  pUVar9 = local_b8;
  icu_63::UnicodeString::UnicodeString(local_b8,&local_70);
LAB_002e7e9f:
  icu_63::UnicodeString::~UnicodeString(&local_70);
  return pUVar9;
}

Assistant:

UnicodeString
DateTimePatternGenerator::mapSkeletonMetacharacters(const UnicodeString& patternForm, int32_t* flags, UErrorCode& status) {
    UnicodeString patternFormMapped;
    patternFormMapped.remove();
    UBool inQuoted = FALSE;
    int32_t patPos, patLen = patternForm.length();
    for (patPos = 0; patPos < patLen; patPos++) {
        UChar patChr = patternForm.charAt(patPos);
        if (patChr == SINGLE_QUOTE) {
            inQuoted = !inQuoted;
        } else if (!inQuoted) {
            // Handle special mappings for 'j' and 'C' in which fields lengths
            // 1,3,5 => hour field length 1
            // 2,4,6 => hour field length 2
            // 1,2 => abbreviated dayPeriod (field length 1..3)
            // 3,4 => long dayPeriod (field length 4)
            // 5,6 => narrow dayPeriod (field length 5)
            if (patChr == LOW_J || patChr == CAP_C) {
                int32_t extraLen = 0; // 1 less than total field length
                while (patPos+1 < patLen && patternForm.charAt(patPos+1)==patChr) {
                    extraLen++;
                    patPos++;
                }
                int32_t hourLen = 1 + (extraLen & 1);
                int32_t dayPeriodLen = (extraLen < 2)? 1: 3 + (extraLen >> 1);
                UChar hourChar = LOW_H;
                UChar dayPeriodChar = LOW_A;
                if (patChr == LOW_J) {
                    hourChar = fDefaultHourFormatChar;
                } else {
                    AllowedHourFormat preferred;
                    if (fAllowedHourFormats[0] != ALLOWED_HOUR_FORMAT_UNKNOWN) {
                        preferred = (AllowedHourFormat)fAllowedHourFormats[0];
                    } else {
                        status = U_INVALID_FORMAT_ERROR;
                        return UnicodeString();
                    }
                    if (preferred == ALLOWED_HOUR_FORMAT_H || preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_Hb) {
                        hourChar = CAP_H;
                    }
                    // in #13183 just add b/B to skeleton, no longer need to set special flags
                    if (preferred == ALLOWED_HOUR_FORMAT_HB || preferred == ALLOWED_HOUR_FORMAT_hB) {
                        dayPeriodChar = CAP_B;
                    } else if (preferred == ALLOWED_HOUR_FORMAT_Hb || preferred == ALLOWED_HOUR_FORMAT_hb) {
                        dayPeriodChar = LOW_B;
                    }
                }
                if (hourChar==CAP_H || hourChar==LOW_K) {
                    dayPeriodLen = 0;
                }
                while (dayPeriodLen-- > 0) {
                    patternFormMapped.append(dayPeriodChar);
                }
                while (hourLen-- > 0) {
                    patternFormMapped.append(hourChar);
                }
            } else if (patChr == CAP_J) {
                // Get pattern for skeleton with H, then replace H or k
                // with fDefaultHourFormatChar (if different)
                patternFormMapped.append(CAP_H);
                *flags |= kDTPGSkeletonUsesCapJ;
            } else {
                patternFormMapped.append(patChr);
            }
        }
    }
    return patternFormMapped;
}